

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlParseLookupSequence
              (htmlParserCtxtPtr ctxt,xmlChar first,xmlChar next,xmlChar third,int ignoreattrval)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  undefined7 in_register_00000009;
  long lVar7;
  long lVar8;
  uint uVar9;
  xmlChar xVar10;
  xmlChar xVar11;
  ulong uVar12;
  size_t sVar6;
  
  pxVar2 = ctxt->input;
  if (pxVar2 != (xmlParserInputPtr)0x0) {
    pxVar5 = pxVar2->base;
    uVar12 = (long)pxVar2->cur - (long)pxVar5;
    uVar4 = (uint)uVar12;
    if (-1 < (int)uVar4) {
      uVar9 = 0;
      if ((long)(ulong)(uVar4 & 0x7fffffff) < ctxt->checkIndex) {
        uVar9 = ctxt->hasPErefs & 1;
        uVar12 = ctxt->checkIndex;
      }
      if (pxVar2->buf == (xmlParserInputBufferPtr)0x0) {
        iVar3 = pxVar2->length;
      }
      else {
        pxVar5 = xmlBufContent(pxVar2->buf->buffer);
        sVar6 = xmlBufUse(pxVar2->buf->buffer);
        iVar3 = (int)sVar6;
      }
      lVar7 = uVar12 << 0x20;
      xVar10 = '\0';
      for (lVar8 = (long)(int)uVar12; lVar8 < (int)(iVar3 + -1 + (uint)(next == '\0'));
          lVar8 = lVar8 + 1) {
        xVar1 = pxVar5[lVar8];
        if ((int)CONCAT71(in_register_00000009,third) == 0) {
LAB_0014f9fd:
          uVar4 = uVar9;
          xVar11 = xVar10;
          if ((xVar1 == first) && ((next == '\0' || (pxVar5[lVar8 + 1] == next)))) {
            ctxt->checkIndex = 0;
            return (*(int *)&pxVar2->base - *(int *)&pxVar2->cur) + (int)uVar12;
          }
        }
        else {
          uVar4 = 1;
          if ((xVar1 == '\'') || (xVar1 == '\"')) {
            xVar11 = xVar1;
            if (uVar9 != 0) {
              if (xVar1 != xVar10) goto LAB_0014f9fd;
              uVar4 = 0;
              xVar11 = xVar10;
            }
          }
          else {
            xVar11 = xVar10;
            if (uVar9 == 0) goto LAB_0014f9fd;
          }
        }
        uVar9 = uVar4;
        lVar7 = lVar7 + 0x100000000;
        uVar12 = (ulong)((int)uVar12 + 1);
        xVar10 = xVar11;
      }
      ctxt->checkIndex = lVar7 >> 0x20;
      if (uVar9 == 0) {
        uVar4 = ctxt->hasPErefs & 0xfffffffe;
      }
      else {
        uVar4 = ctxt->hasPErefs | 1;
      }
      ctxt->hasPErefs = uVar4;
    }
  }
  return -1;
}

Assistant:

static int
htmlParseLookupSequence(htmlParserCtxtPtr ctxt, xmlChar first,
                        xmlChar next, xmlChar third, int ignoreattrval)
{
    int base, len;
    htmlParserInputPtr in;
    const xmlChar *buf;
    int invalue = 0;
    char valdellim = 0x0;

    in = ctxt->input;
    if (in == NULL)
        return (-1);

    base = in->cur - in->base;
    if (base < 0)
        return (-1);

    if (ctxt->checkIndex > base) {
        base = ctxt->checkIndex;
        /* Abuse hasPErefs member to restore current state. */
        invalue = ctxt->hasPErefs & 1 ? 1 : 0;
    }

    if (in->buf == NULL) {
        buf = in->base;
        len = in->length;
    } else {
        buf = xmlBufContent(in->buf->buffer);
        len = xmlBufUse(in->buf->buffer);
    }

    /* take into account the sequence length */
    if (third)
        len -= 2;
    else if (next)
        len--;
    for (; base < len; base++) {
        if (ignoreattrval) {
            if (buf[base] == '"' || buf[base] == '\'') {
                if (invalue) {
                    if (buf[base] == valdellim) {
                        invalue = 0;
                        continue;
                    }
                } else {
                    valdellim = buf[base];
                    invalue = 1;
                    continue;
                }
            } else if (invalue) {
                continue;
            }
        }
        if (buf[base] == first) {
            if (third != 0) {
                if ((buf[base + 1] != next) || (buf[base + 2] != third))
                    continue;
            } else if (next != 0) {
                if (buf[base + 1] != next)
                    continue;
            }
            ctxt->checkIndex = 0;
#ifdef DEBUG_PUSH
            if (next == 0)
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c' found at %d\n",
                                first, base);
            else if (third == 0)
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c%c' found at %d\n",
                                first, next, base);
            else
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c%c%c' found at %d\n",
                                first, next, third, base);
#endif
            return (base - (in->cur - in->base));
        }
    }
    ctxt->checkIndex = base;
    /* Abuse hasPErefs member to track current state. */
    if (invalue)
        ctxt->hasPErefs |= 1;
    else
        ctxt->hasPErefs &= ~1;
#ifdef DEBUG_PUSH
    if (next == 0)
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c' failed\n", first);
    else if (third == 0)
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c%c' failed\n", first, next);
    else
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c%c%c' failed\n", first, next,
                        third);
#endif
    return (-1);
}